

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

void Vec_IntPrint(Vec_Int_t *vVec)

{
  long lVar1;
  
  printf("Vector has %d entries: {",(ulong)(uint)vVec->nSize);
  if (0 < vVec->nSize) {
    lVar1 = 0;
    do {
      printf(" %d",(ulong)(uint)vVec->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vVec->nSize);
  }
  puts(" }");
  return;
}

Assistant:

static inline void Vec_IntPrint( Vec_Int_t * vVec )
{
    int i, Entry;
    printf( "Vector has %d entries: {", Vec_IntSize(vVec) );
    Vec_IntForEachEntry( vVec, Entry, i )
        printf( " %d", Entry );
    printf( " }\n" );
}